

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_47(QPDF *pdf,char *arg2)

{
  ulong uVar1;
  long lVar2;
  size_type sVar3;
  longlong lVar4;
  ostream *poVar5;
  string local_110 [32];
  ulong local_f0;
  size_t i;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [48];
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  long local_40;
  longlong npages;
  QPDFPageLabelDocumentHelper pldh;
  char *arg2_local;
  QPDF *pdf_local;
  
  pldh.m.super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)&npages,pdf);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Pages",&local_a1);
  QPDFObjectHandle::getKey((string *)&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"/Count",
             (allocator<char> *)
             ((long)&labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  QPDFObjectHandle::getKey((string *)&local_50);
  lVar2 = QPDFObjectHandle::getIntValue();
  QPDFObjectHandle::~QPDFObjectHandle(&local_50);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_60);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  local_40 = lVar2;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i);
  QPDFPageLabelDocumentHelper::getLabelsForPageRange
            ((longlong)&npages,0,local_40 + -1,(vector *)0x1);
  sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i);
  if ((sVar3 & 1) == 0) {
    local_f0 = 0;
    while( true ) {
      uVar1 = local_f0;
      sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i);
      if (sVar3 <= uVar1) break;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i,local_f0);
      lVar4 = QPDFObjectHandle::getIntValue();
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,lVar4);
      poVar5 = std::operator<<(poVar5," ");
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i,local_f0 + 1);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,local_110);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_110);
      local_f0 = local_f0 + 2;
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&i);
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
              ((QPDFPageLabelDocumentHelper *)&npages);
    return;
  }
  __assert_fail("labels.size() % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x713,"void test_47(QPDF &, const char *)");
}

Assistant:

static void
test_47(QPDF& pdf, char const* arg2)
{
    // Test page labels.
    QPDFPageLabelDocumentHelper pldh(pdf);
    long long npages = pdf.getRoot().getKey("/Pages").getKey("/Count").getIntValue();
    std::vector<QPDFObjectHandle> labels;
    pldh.getLabelsForPageRange(0, npages - 1, 1, labels);
    assert(labels.size() % 2 == 0);
    for (size_t i = 0; i < labels.size(); i += 2) {
        std::cout << labels.at(i).getIntValue() << " " << labels.at(i + 1).unparse() << std::endl;
    }
}